

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RunVacuum(char **pzErrMsg,sqlite3 *db,int iDb,sqlite3_value *pOut)

{
  u8 uVar1;
  uint uVar2;
  u32 uVar3;
  u64 uVar4;
  i64 iVar5;
  i64 iVar6;
  char *pcVar7;
  sqlite3 *p;
  int iVar8;
  int iVar9;
  int iVar10;
  Pager *pPVar11;
  sqlite3_file *psVar12;
  sqlite3_value *in_RCX;
  int in_EDX;
  sqlite3 *in_RSI;
  char **in_RDI;
  long in_FS_OFFSET;
  int i;
  sqlite3_file *id;
  u32 pgflags;
  char *zOut;
  char *zDbMain;
  int nDb;
  int nRes;
  int isMemDb;
  Db *pDb;
  u8 saved_mTrace;
  u32 saved_openFlags;
  i64 saved_nTotalChange;
  i64 saved_nChange;
  u64 saved_flags;
  u32 saved_mDbFlags;
  Btree *pTemp;
  Btree *pMain;
  int rc;
  u32 meta;
  i64 sz;
  u64 iRandom;
  char zDbVacuum [42];
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  sqlite3 *in_stack_fffffffffffffee0;
  sqlite3 *p_00;
  sqlite3 *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  sqlite3 *in_stack_fffffffffffffef8;
  char **in_stack_ffffffffffffff00;
  sqlite3 *db_00;
  int local_ec;
  uchar *local_d8;
  Db *local_b8;
  int local_74;
  char local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = (Db *)0x0;
  memset(local_38,0xaa,0x2a);
  if (in_RSI->autoCommit == '\0') {
    sqlite3SetString((char **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
    local_74 = 1;
    goto LAB_0018d0c2;
  }
  if (1 < in_RSI->nVdbeActive) {
    sqlite3SetString((char **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
    local_74 = 1;
    goto LAB_0018d0c2;
  }
  uVar2 = in_RSI->openFlags;
  if (in_RCX == (sqlite3_value *)0x0) {
    local_d8 = "";
  }
  else {
    iVar8 = sqlite3_value_type(in_RCX);
    if (iVar8 != 3) {
      sqlite3SetString((char **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
      local_74 = 1;
      goto LAB_0018d0c2;
    }
    local_d8 = sqlite3_value_text((sqlite3_value *)0x18c860);
    in_RSI->openFlags = in_RSI->openFlags & 0xfffffffe;
    in_RSI->openFlags = in_RSI->openFlags | 6;
  }
  uVar4 = in_RSI->flags;
  uVar3 = in_RSI->mDbFlags;
  iVar5 = in_RSI->nChange;
  iVar6 = in_RSI->nTotalChange;
  uVar1 = in_RSI->mTrace;
  in_RSI->flags = in_RSI->flags | 0x201;
  in_RSI->mDbFlags = in_RSI->mDbFlags | 6;
  in_RSI->flags = in_RSI->flags & 0xfffffffeefffafff;
  in_RSI->mTrace = '\0';
  pcVar7 = in_RSI->aDb[in_EDX].zDbSName;
  p_00 = (sqlite3 *)in_RSI->aDb[in_EDX].pBt;
  pPVar11 = sqlite3BtreePager((Btree *)p_00);
  iVar9 = sqlite3PagerIsMemdb(pPVar11);
  sqlite3_randomness(in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
  sqlite3_snprintf(0x2a,local_38,"vacuum_%016llx",&DAT_aaaaaaaaaaaaaaaa);
  iVar8 = in_RSI->nDb;
  local_74 = execSqlF(in_RSI,in_RDI,"ATTACH %Q AS %s",local_d8,local_38);
  in_RSI->openFlags = uVar2;
  if (local_74 == 0) {
    local_b8 = in_RSI->aDb + iVar8;
    p = (sqlite3 *)local_b8->pBt;
    if (in_RCX != (sqlite3_value *)0x0) {
      pPVar11 = sqlite3BtreePager((Btree *)p);
      psVar12 = sqlite3PagerFile(pPVar11);
      if ((psVar12->pMethods != (sqlite3_io_methods *)0x0) &&
         (iVar10 = sqlite3OsFileSize((sqlite3_file *)in_stack_fffffffffffffee0,
                                     (i64 *)CONCAT44(in_stack_fffffffffffffedc,
                                                     in_stack_fffffffffffffed8)), iVar10 != 0)) {
        local_74 = 1;
        sqlite3SetString((char **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
        goto LAB_0018cfe3;
      }
      in_RSI->mDbFlags = in_RSI->mDbFlags | 8;
    }
    sqlite3BtreeGetRequestedReserve((Btree *)in_stack_fffffffffffffee0);
    sqlite3BtreeSetCacheSize((Btree *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    db_00 = p;
    sqlite3BtreeSetSpillSize
              ((Btree *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    sqlite3BtreeSetSpillSize
              ((Btree *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    sqlite3BtreeSetPagerFlags((Btree *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    local_74 = execSql(db_00,in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    if ((local_74 == 0) &&
       (local_74 = sqlite3BtreeBeginTrans
                             ((Btree *)in_stack_fffffffffffffee8,
                              (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                              (int *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
       local_74 == 0)) {
      pPVar11 = sqlite3BtreePager((Btree *)p_00);
      iVar10 = sqlite3PagerGetJournalMode(pPVar11);
      if ((iVar10 == 5) && (in_RCX == (sqlite3_value *)0x0)) {
        in_RSI->nextPagesize = 0;
      }
      sqlite3BtreeGetPageSize((Btree *)p_00);
      iVar10 = sqlite3BtreeSetPageSize
                         ((Btree *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                          in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20))
      ;
      if ((iVar10 == 0) &&
         (((iVar9 != 0 ||
           (iVar9 = sqlite3BtreeSetPageSize
                              ((Btree *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                               in_stack_fffffffffffffef0,
                               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20)), iVar9 == 0)) &&
          (in_RSI->mallocFailed == '\0')))) {
        in_stack_fffffffffffffef8 = p;
        if (in_RSI->nextAutovac < '\0') {
          in_stack_fffffffffffffef4 = sqlite3BtreeGetAutoVacuum((Btree *)in_stack_fffffffffffffee0);
        }
        else {
          in_stack_fffffffffffffef4 = (int)in_RSI->nextAutovac;
        }
        sqlite3BtreeSetAutoVacuum
                  ((Btree *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        (in_RSI->init).iDb = (u8)iVar8;
        local_74 = execSqlF(in_RSI,in_RDI,
                            "SELECT sql FROM \"%w\".sqlite_schema WHERE type=\'table\'AND name<>\'sqlite_sequence\' AND coalesce(rootpage,1)>0"
                            ,pcVar7);
        if ((local_74 == 0) &&
           (local_74 = execSqlF(in_RSI,in_RDI,
                                "SELECT sql FROM \"%w\".sqlite_schema WHERE type=\'index\'",pcVar7),
           local_74 == 0)) {
          (in_RSI->init).iDb = '\0';
          local_74 = execSqlF(in_RSI,in_RDI,
                              "SELECT\'INSERT INTO %s.\'||quote(name)||\' SELECT*FROM\"%w\".\'||quote(name)FROM %s.sqlite_schema WHERE type=\'table\'AND coalesce(rootpage,1)>0"
                              ,local_38,pcVar7,local_38);
          in_RSI->mDbFlags = in_RSI->mDbFlags & 0xfffffffb;
          if ((local_74 == 0) &&
             (local_74 = execSqlF(in_RSI,in_RDI,
                                  "INSERT INTO %s.sqlite_schema SELECT*FROM \"%w\".sqlite_schema WHERE type IN(\'view\',\'trigger\') OR(type=\'table\'AND rootpage=0)"
                                  ,local_38,pcVar7), local_74 == 0)) {
            for (local_ec = 0; local_ec < 10; local_ec = local_ec + 2) {
              sqlite3BtreeGetMeta((Btree *)CONCAT44(in_stack_fffffffffffffef4,
                                                    in_stack_fffffffffffffef0),
                                  (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                                  (u32 *)in_stack_fffffffffffffee0);
              local_74 = sqlite3BtreeUpdateMeta
                                   ((Btree *)CONCAT44(in_stack_fffffffffffffef4,
                                                      in_stack_fffffffffffffef0),
                                    (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                                    (u32)in_stack_fffffffffffffee8);
              if (local_74 != 0) goto LAB_0018cfe3;
            }
            if (in_RCX == (sqlite3_value *)0x0) {
              local_74 = sqlite3BtreeCopyFile
                                   ((Btree *)in_stack_fffffffffffffef8,
                                    (Btree *)CONCAT44(in_stack_fffffffffffffef4,
                                                      in_stack_fffffffffffffef0));
            }
            if ((local_74 == 0) &&
               (local_74 = sqlite3BtreeCommit((Btree *)in_stack_fffffffffffffee0), local_74 == 0)) {
              if (in_RCX == (sqlite3_value *)0x0) {
                in_stack_fffffffffffffee8 = p_00;
                sqlite3BtreeGetAutoVacuum((Btree *)in_stack_fffffffffffffee0);
                sqlite3BtreeSetAutoVacuum
                          ((Btree *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
              }
              if (in_RCX == (sqlite3_value *)0x0) {
                sqlite3BtreeGetRequestedReserve((Btree *)in_stack_fffffffffffffee0);
                sqlite3BtreeGetPageSize((Btree *)p);
                local_74 = sqlite3BtreeSetPageSize
                                     ((Btree *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                                      in_stack_fffffffffffffef0,
                                      (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
                in_stack_fffffffffffffee0 = p_00;
              }
            }
          }
        }
      }
      else {
        local_74 = 7;
      }
    }
  }
LAB_0018cfe3:
  (in_RSI->init).iDb = '\0';
  in_RSI->mDbFlags = uVar3;
  in_RSI->flags = uVar4;
  in_RSI->nChange = iVar5;
  in_RSI->nTotalChange = iVar6;
  in_RSI->mTrace = uVar1;
  sqlite3BtreeSetPageSize
            ((Btree *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
             (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  in_RSI->autoCommit = '\x01';
  if (local_b8 != (Db *)0x0) {
    sqlite3BtreeClose((Btree *)in_stack_fffffffffffffee0);
    local_b8->pBt = (Btree *)0x0;
    local_b8->pSchema = (Schema *)0x0;
  }
  sqlite3ResetAllSchemasOfConnection(in_stack_fffffffffffffee0);
LAB_0018d0c2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_74;
}

Assistant:

int sqlite3RunVacuum(
  char **pzErrMsg,        /* Write error message here */
  sqlite3 *db,            /* Database connection */
  int iDb,                /* Which attached DB to vacuum */
  sqlite3_value *pOut     /* Write results here, if not NULL. VACUUM INTO */
){
  int rc = SQLITE_OK;     /* Return code from service routines */
  Btree *pMain;           /* The database being vacuumed */
  Btree *pTemp;           /* The temporary database we vacuum into */
  u32 saved_mDbFlags;     /* Saved value of db->mDbFlags */
  u64 saved_flags;        /* Saved value of db->flags */
  i64 saved_nChange;      /* Saved value of db->nChange */
  i64 saved_nTotalChange; /* Saved value of db->nTotalChange */
  u32 saved_openFlags;    /* Saved value of db->openFlags */
  u8 saved_mTrace;        /* Saved trace settings */
  Db *pDb = 0;            /* Database to detach at end of vacuum */
  int isMemDb;            /* True if vacuuming a :memory: database */
  int nRes;               /* Bytes of reserved space at the end of each page */
  int nDb;                /* Number of attached databases */
  const char *zDbMain;    /* Schema name of database to vacuum */
  const char *zOut;       /* Name of output file */
  u32 pgflags = PAGER_SYNCHRONOUS_OFF; /* sync flags for output db */
  u64 iRandom;            /* Random value used for zDbVacuum[] */
  char zDbVacuum[42];     /* Name of the ATTACH-ed database used for vacuum */


  if( !db->autoCommit ){
    sqlite3SetString(pzErrMsg, db, "cannot VACUUM from within a transaction");
    return SQLITE_ERROR; /* IMP: R-12218-18073 */
  }
  if( db->nVdbeActive>1 ){
    sqlite3SetString(pzErrMsg, db,"cannot VACUUM - SQL statements in progress");
    return SQLITE_ERROR; /* IMP: R-15610-35227 */
  }
  saved_openFlags = db->openFlags;
  if( pOut ){
    if( sqlite3_value_type(pOut)!=SQLITE_TEXT ){
      sqlite3SetString(pzErrMsg, db, "non-text filename");
      return SQLITE_ERROR;
    }
    zOut = (const char*)sqlite3_value_text(pOut);
    db->openFlags &= ~SQLITE_OPEN_READONLY;
    db->openFlags |= SQLITE_OPEN_CREATE|SQLITE_OPEN_READWRITE;
  }else{
    zOut = "";
  }

  /* Save the current value of the database flags so that it can be
  ** restored before returning. Then set the writable-schema flag, and
  ** disable CHECK and foreign key constraints.  */
  saved_flags = db->flags;
  saved_mDbFlags = db->mDbFlags;
  saved_nChange = db->nChange;
  saved_nTotalChange = db->nTotalChange;
  saved_mTrace = db->mTrace;
  db->flags |= SQLITE_WriteSchema | SQLITE_IgnoreChecks;
  db->mDbFlags |= DBFLAG_PreferBuiltin | DBFLAG_Vacuum;
  db->flags &= ~(u64)(SQLITE_ForeignKeys | SQLITE_ReverseOrder
                   | SQLITE_Defensive | SQLITE_CountRows);
  db->mTrace = 0;

  zDbMain = db->aDb[iDb].zDbSName;
  pMain = db->aDb[iDb].pBt;
  isMemDb = sqlite3PagerIsMemdb(sqlite3BtreePager(pMain));

  /* Attach the temporary database as 'vacuum_XXXXXX'. The synchronous pragma
  ** can be set to 'off' for this file, as it is not recovered if a crash
  ** occurs anyway. The integrity of the database is maintained by a
  ** (possibly synchronous) transaction opened on the main database before
  ** sqlite3BtreeCopyFile() is called.
  **
  ** An optimization would be to use a non-journaled pager.
  ** (Later:) I tried setting "PRAGMA vacuum_XXXXXX.journal_mode=OFF" but
  ** that actually made the VACUUM run slower.  Very little journalling
  ** actually occurs when doing a vacuum since the vacuum_db is initially
  ** empty.  Only the journal header is written.  Apparently it takes more
  ** time to parse and run the PRAGMA to turn journalling off than it does
  ** to write the journal header file.
  */
  sqlite3_randomness(sizeof(iRandom),&iRandom);
  sqlite3_snprintf(sizeof(zDbVacuum), zDbVacuum, "vacuum_%016llx", iRandom);
  nDb = db->nDb;
  rc = execSqlF(db, pzErrMsg, "ATTACH %Q AS %s", zOut, zDbVacuum);
  db->openFlags = saved_openFlags;
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  assert( (db->nDb-1)==nDb );
  pDb = &db->aDb[nDb];
  assert( strcmp(pDb->zDbSName,zDbVacuum)==0 );
  pTemp = pDb->pBt;
  if( pOut ){
    sqlite3_file *id = sqlite3PagerFile(sqlite3BtreePager(pTemp));
    i64 sz = 0;
    if( id->pMethods!=0 && (sqlite3OsFileSize(id, &sz)!=SQLITE_OK || sz>0) ){
      rc = SQLITE_ERROR;
      sqlite3SetString(pzErrMsg, db, "output file already exists");
      goto end_of_vacuum;
    }
    db->mDbFlags |= DBFLAG_VacuumInto;

    /* For a VACUUM INTO, the pager-flags are set to the same values as
    ** they are for the database being vacuumed, except that PAGER_CACHESPILL
    ** is always set. */
    pgflags = db->aDb[iDb].safety_level | (db->flags & PAGER_FLAGS_MASK);
  }
  nRes = sqlite3BtreeGetRequestedReserve(pMain);

  sqlite3BtreeSetCacheSize(pTemp, db->aDb[iDb].pSchema->cache_size);
  sqlite3BtreeSetSpillSize(pTemp, sqlite3BtreeSetSpillSize(pMain,0));
  sqlite3BtreeSetPagerFlags(pTemp, pgflags|PAGER_CACHESPILL);

  /* Begin a transaction and take an exclusive lock on the main database
  ** file. This is done before the sqlite3BtreeGetPageSize(pMain) call below,
  ** to ensure that we do not try to change the page-size on a WAL database.
  */
  rc = execSql(db, pzErrMsg, "BEGIN");
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  rc = sqlite3BtreeBeginTrans(pMain, pOut==0 ? 2 : 0, 0);
  if( rc!=SQLITE_OK ) goto end_of_vacuum;

  /* Do not attempt to change the page size for a WAL database */
  if( sqlite3PagerGetJournalMode(sqlite3BtreePager(pMain))
                                               ==PAGER_JOURNALMODE_WAL
   && pOut==0
  ){
    db->nextPagesize = 0;
  }

  if( sqlite3BtreeSetPageSize(pTemp, sqlite3BtreeGetPageSize(pMain), nRes, 0)
   || (!isMemDb && sqlite3BtreeSetPageSize(pTemp, db->nextPagesize, nRes, 0))
   || NEVER(db->mallocFailed)
  ){
    rc = SQLITE_NOMEM_BKPT;
    goto end_of_vacuum;
  }

#ifndef SQLITE_OMIT_AUTOVACUUM
  sqlite3BtreeSetAutoVacuum(pTemp, db->nextAutovac>=0 ? db->nextAutovac :
                                           sqlite3BtreeGetAutoVacuum(pMain));
#endif

  /* Query the schema of the main database. Create a mirror schema
  ** in the temporary database.
  */
  db->init.iDb = nDb; /* force new CREATE statements into vacuum_db */
  rc = execSqlF(db, pzErrMsg,
      "SELECT sql FROM \"%w\".sqlite_schema"
      " WHERE type='table'AND name<>'sqlite_sequence'"
      " AND coalesce(rootpage,1)>0",
      zDbMain
  );
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  rc = execSqlF(db, pzErrMsg,
      "SELECT sql FROM \"%w\".sqlite_schema"
      " WHERE type='index'",
      zDbMain
  );
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  db->init.iDb = 0;

  /* Loop through the tables in the main database. For each, do
  ** an "INSERT INTO vacuum_db.xxx SELECT * FROM main.xxx;" to copy
  ** the contents to the temporary database.
  */
  rc = execSqlF(db, pzErrMsg,
      "SELECT'INSERT INTO %s.'||quote(name)"
      "||' SELECT*FROM\"%w\".'||quote(name)"
      "FROM %s.sqlite_schema "
      "WHERE type='table'AND coalesce(rootpage,1)>0",
      zDbVacuum, zDbMain, zDbVacuum
  );
  assert( (db->mDbFlags & DBFLAG_Vacuum)!=0 );
  db->mDbFlags &= ~DBFLAG_Vacuum;
  if( rc!=SQLITE_OK ) goto end_of_vacuum;

  /* Copy the triggers, views, and virtual tables from the main database
  ** over to the temporary database.  None of these objects has any
  ** associated storage, so all we have to do is copy their entries
  ** from the schema table.
  */
  rc = execSqlF(db, pzErrMsg,
      "INSERT INTO %s.sqlite_schema"
      " SELECT*FROM \"%w\".sqlite_schema"
      " WHERE type IN('view','trigger')"
      " OR(type='table'AND rootpage=0)",
      zDbVacuum, zDbMain
  );
  if( rc ) goto end_of_vacuum;

  /* At this point, there is a write transaction open on both the
  ** vacuum database and the main database. Assuming no error occurs,
  ** both transactions are closed by this block - the main database
  ** transaction by sqlite3BtreeCopyFile() and the other by an explicit
  ** call to sqlite3BtreeCommit().
  */
  {
    u32 meta;
    int i;

    /* This array determines which meta meta values are preserved in the
    ** vacuum.  Even entries are the meta value number and odd entries
    ** are an increment to apply to the meta value after the vacuum.
    ** The increment is used to increase the schema cookie so that other
    ** connections to the same database will know to reread the schema.
    */
    static const unsigned char aCopy[] = {
       BTREE_SCHEMA_VERSION,     1,  /* Add one to the old schema cookie */
       BTREE_DEFAULT_CACHE_SIZE, 0,  /* Preserve the default page cache size */
       BTREE_TEXT_ENCODING,      0,  /* Preserve the text encoding */
       BTREE_USER_VERSION,       0,  /* Preserve the user version */
       BTREE_APPLICATION_ID,     0,  /* Preserve the application id */
    };

    assert( SQLITE_TXN_WRITE==sqlite3BtreeTxnState(pTemp) );
    assert( pOut!=0 || SQLITE_TXN_WRITE==sqlite3BtreeTxnState(pMain) );

    /* Copy Btree meta values */
    for(i=0; i<ArraySize(aCopy); i+=2){
      /* GetMeta() and UpdateMeta() cannot fail in this context because
      ** we already have page 1 loaded into cache and marked dirty. */
      sqlite3BtreeGetMeta(pMain, aCopy[i], &meta);
      rc = sqlite3BtreeUpdateMeta(pTemp, aCopy[i], meta+aCopy[i+1]);
      if( NEVER(rc!=SQLITE_OK) ) goto end_of_vacuum;
    }

    if( pOut==0 ){
      rc = sqlite3BtreeCopyFile(pMain, pTemp);
    }
    if( rc!=SQLITE_OK ) goto end_of_vacuum;
    rc = sqlite3BtreeCommit(pTemp);
    if( rc!=SQLITE_OK ) goto end_of_vacuum;
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pOut==0 ){
      sqlite3BtreeSetAutoVacuum(pMain, sqlite3BtreeGetAutoVacuum(pTemp));
    }
#endif
  }

  assert( rc==SQLITE_OK );
  if( pOut==0 ){
    nRes = sqlite3BtreeGetRequestedReserve(pTemp);
    rc = sqlite3BtreeSetPageSize(pMain, sqlite3BtreeGetPageSize(pTemp), nRes,1);
  }

end_of_vacuum:
  /* Restore the original value of db->flags */
  db->init.iDb = 0;
  db->mDbFlags = saved_mDbFlags;
  db->flags = saved_flags;
  db->nChange = saved_nChange;
  db->nTotalChange = saved_nTotalChange;
  db->mTrace = saved_mTrace;
  sqlite3BtreeSetPageSize(pMain, -1, 0, 1);

  /* Currently there is an SQL level transaction open on the vacuum
  ** database. No locks are held on any other files (since the main file
  ** was committed at the btree level). So it safe to end the transaction
  ** by manually setting the autoCommit flag to true and detaching the
  ** vacuum database. The vacuum_db journal file is deleted when the pager
  ** is closed by the DETACH.
  */
  db->autoCommit = 1;

  if( pDb ){
    sqlite3BtreeClose(pDb->pBt);
    pDb->pBt = 0;
    pDb->pSchema = 0;
  }

  /* This both clears the schemas and reduces the size of the db->aDb[]
  ** array. */
  sqlite3ResetAllSchemasOfConnection(db);

  return rc;
}